

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileTree.cpp
# Opt level: O0

PCASC_FILE_NODE __thiscall
CASC_FILE_TREE::Insert
          (CASC_FILE_TREE *this,PCONTENT_KEY pCKey,ULONGLONG NameHash,DWORD DataId,DWORD FileSize,
          DWORD LocaleId)

{
  PCASC_FILE_NODE pFileNode_00;
  PCASC_FILE_NODE pFileNode;
  DWORD LocaleId_local;
  DWORD FileSize_local;
  DWORD DataId_local;
  ULONGLONG NameHash_local;
  PCONTENT_KEY pCKey_local;
  CASC_FILE_TREE *this_local;
  
  pFileNode_00 = GetOrInsert(this,NameHash,(char *)0x0,(char *)0x0,pCKey,0,DataId);
  if (pFileNode_00 != (PCASC_FILE_NODE)0x0) {
    SetExtras(this,pFileNode_00,FileSize,LocaleId);
  }
  return pFileNode_00;
}

Assistant:

PCASC_FILE_NODE CASC_FILE_TREE::Insert(PCONTENT_KEY pCKey, ULONGLONG NameHash, DWORD DataId, DWORD FileSize, DWORD LocaleId)
{
    PCASC_FILE_NODE pFileNode;
    
    pFileNode = GetOrInsert(NameHash, NULL, NULL, pCKey, 0, DataId);
    if(pFileNode != NULL)
    {
        SetExtras(pFileNode, FileSize, LocaleId);
    }

    return pFileNode;
}